

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O2

void sethookaux(lua_State *L,int mask,int count,char *scpt)

{
  int iVar1;
  code *func;
  
  if (*scpt == '\0') {
    func = (lua_Hook)0x0;
    mask = 0;
    count = 0;
  }
  else {
    lua_getfield(L,-0xf4628,"C_HOOK");
    iVar1 = lua_type(L,-1);
    if (iVar1 != 5) {
      lua_settop(L,-2);
      lua_createtable(L,0,0);
      lua_pushvalue(L,-1);
      lua_setfield(L,-0xf4628,"C_HOOK");
    }
    lua_pushlightuserdata(L,L);
    lua_pushstring(L,scpt);
    lua_settable(L,-3);
    func = Chook;
  }
  lua_sethook(L,func,mask,count);
  return;
}

Assistant:

static void sethookaux (lua_State *L, int mask, int count, const char *scpt) {
  if (*scpt == '\0') {  /* no script? */
    lua_sethook(L, NULL, 0, 0);  /* turn off hooks */
    return;
  }
  lua_getfield(L, LUA_REGISTRYINDEX, "C_HOOK");  /* get C_HOOK table */
  if (!lua_istable(L, -1)) {  /* no hook table? */
    lua_pop(L, 1);  /* remove previous value */
    lua_newtable(L);  /* create new C_HOOK table */
    lua_pushvalue(L, -1);
    lua_setfield(L, LUA_REGISTRYINDEX, "C_HOOK");  /* register it */
  }
  lua_pushlightuserdata(L, L);
  lua_pushstring(L, scpt);
  lua_settable(L, -3);  /* C_HOOK[L] = script */
  lua_sethook(L, Chook, mask, count);
}